

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-filepath.cc
# Opt level: O3

FilePath * __thiscall
testing::internal::FilePath::RemoveExtension
          (FilePath *__return_storage_ptr__,FilePath *this,char *extension)

{
  pointer pcVar1;
  bool bVar2;
  long *plVar3;
  size_type *psVar4;
  string dot_extension;
  string local_68;
  long *local_48;
  long local_40;
  long local_38 [2];
  
  local_48 = local_38;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,".","");
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_48);
  psVar4 = (size_type *)(plVar3 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar3 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar4) {
    local_68.field_2._M_allocated_capacity = *psVar4;
    local_68.field_2._8_8_ = plVar3[3];
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  }
  else {
    local_68.field_2._M_allocated_capacity = *psVar4;
    local_68._M_dataplus._M_p = (pointer)*plVar3;
  }
  local_68._M_string_length = plVar3[1];
  *plVar3 = (long)psVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  if (local_48 != local_38) {
    operator_delete(local_48,local_38[0] + 1);
  }
  bVar2 = String::EndsWithCaseInsensitive(&this->pathname_,&local_68);
  if (bVar2) {
    std::__cxx11::string::substr((ulong)&local_48,(ulong)this);
    (__return_storage_ptr__->pathname_)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->pathname_).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,local_48,local_40 + (long)local_48);
    Normalize(__return_storage_ptr__);
    if (local_48 != local_38) {
      operator_delete(local_48,local_38[0] + 1);
    }
  }
  else {
    (__return_storage_ptr__->pathname_)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->pathname_).field_2;
    pcVar1 = (this->pathname_)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar1,pcVar1 + (this->pathname_)._M_string_length);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

FilePath FilePath::RemoveExtension(const char* extension) const {
  const std::string dot_extension = std::string(".") + extension;
  if (String::EndsWithCaseInsensitive(pathname_, dot_extension)) {
    return FilePath(pathname_.substr(
        0, pathname_.length() - dot_extension.length()));
  }
  return *this;
}